

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

bool __thiscall duckdb::CSVErrorHandler::AnyErrors(CSVErrorHandler *this)

{
  pointer pCVar1;
  pointer pCVar2;
  
  ::std::mutex::lock(&this->main_mutex);
  pCVar1 = (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
           super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
           super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return pCVar1 != pCVar2;
}

Assistant:

bool CSVErrorHandler::AnyErrors() {
	lock_guard<mutex> parallel_lock(main_mutex);
	return !errors.empty();
}